

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

void getstacktrace(void **ents,int max_ents)

{
  void **ppvVar1;
  int local_34;
  int frameno;
  void **newBp;
  void **bp;
  void **ip;
  int max_ents_local;
  void **ents_local;
  
  getframe();
  for (local_34 = 0; local_34 < max_ents; local_34 = local_34 + 1) {
    ppvVar1 = (void **)*newBp;
    if ((((ppvVar1 == (void **)0x0) || (ppvVar1 <= newBp)) ||
        (0x10000 < (long)ppvVar1 - (long)newBp >> 3)) || (newBp[1] == (void *)0x0)) break;
    ents[local_34] = newBp[1];
    newBp = ppvVar1;
  }
  if (local_34 < max_ents) {
    ents[local_34] = (void *)0x0;
  }
  return;
}

Assistant:

static void getstacktrace(void **ents, int max_ents) {
    void **ip, **bp, **newBp;
    getframe(&bp, &ip);
    int frameno;
    for (frameno = 0; frameno < max_ents; ++frameno) {
        newBp = (void **)bp[0];
        ip = (void **)bp[1];
        /*
         * Make sure we are making progress, terminate on massive stack frames,
         * or when IP == 0
         */
        if (!newBp || newBp <= bp || newBp - bp > 65536 || ip == 0)
            break;
        bp = newBp;
        ents[frameno] = ip;
    }
    if (frameno < max_ents) // null terminate if less than full size.
       ents[frameno] = 0;
}